

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O3

int gen_publickey_from_rsa_evp
              (LIBSSH2_SESSION *session,uchar **method,size_t *method_len,uchar **pubkeydata,
              size_t *pubkeydata_len,EVP_PKEY *pk)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uchar *puVar4;
  uchar *buf;
  uchar *puVar5;
  BIGNUM *n;
  BIGNUM *e;
  BIGNUM *local_58;
  uchar **local_50;
  size_t *local_48;
  uchar **local_40;
  BIGNUM *local_38;
  
  local_40 = method;
  puVar4 = (uchar *)(*session->alloc)(7,&session->abstract);
  if (puVar4 != (uchar *)0x0) {
    local_38 = (BIGNUM *)0x0;
    local_58 = (BIGNUM *)0x0;
    local_50 = pubkeydata;
    local_48 = pubkeydata_len;
    EVP_PKEY_get_bn_param(pk,"e",&local_38);
    EVP_PKEY_get_bn_param(pk,"n",&local_58);
    if ((local_38 != (BIGNUM *)0x0) && (local_58 != (BIGNUM *)0x0)) {
      iVar1 = BN_num_bits(local_38);
      iVar3 = iVar1 + 0xe;
      if (-1 < iVar1 + 7) {
        iVar3 = iVar1 + 7;
      }
      iVar2 = BN_num_bits(local_58);
      iVar1 = iVar2 + 0xe;
      if (-1 < iVar2 + 7) {
        iVar1 = iVar2 + 7;
      }
      buf = (uchar *)(*session->alloc)((long)((iVar3 >> 3) + (iVar1 >> 3) + 0x15),&session->abstract
                                      );
      if (buf != (uchar *)0x0) {
        _libssh2_htonu32(buf,7);
        builtin_memcpy(buf + 4,"ssh-rsa",7);
        puVar5 = write_bn(buf + 0xb,(BIGNUM *)local_38,(iVar3 >> 3) + 1);
        puVar5 = write_bn(puVar5,(BIGNUM *)local_58,(iVar1 >> 3) + 1);
        builtin_memcpy(puVar4,"ssh-rsa",7);
        *local_40 = puVar4;
        if (method_len != (size_t *)0x0) {
          *method_len = 7;
        }
        *local_50 = buf;
        if (local_48 == (size_t *)0x0) {
          return 0;
        }
        *local_48 = (long)puVar5 - (long)buf;
        return 0;
      }
    }
    (*session->free)(puVar4,&session->abstract);
  }
  iVar3 = _libssh2_error(session,-6,"Unable to allocate memory for private key data");
  return iVar3;
}

Assistant:

static int
gen_publickey_from_rsa_evp(LIBSSH2_SESSION *session,
                           unsigned char **method,
                           size_t *method_len,
                           unsigned char **pubkeydata,
                           size_t *pubkeydata_len,
                           EVP_PKEY *pk)
{
    libssh2_rsa_ctx* rsa = NULL;
    unsigned char *key;
    unsigned char *method_buf = NULL;
    size_t  key_len;

    _libssh2_debug((session,
                   LIBSSH2_TRACE_AUTH,
                   "Computing public key from RSA private key envelope"));

#ifdef USE_OPENSSL_3
    rsa = pk;
#else
    rsa = EVP_PKEY_get1_RSA(pk);
#endif
    if(!rsa) {
        /* Assume memory allocation error... what else could it be ? */
        goto __alloc_error;
    }

    method_buf = LIBSSH2_ALLOC(session, 7);  /* ssh-rsa. */
    if(!method_buf) {
        goto __alloc_error;
    }

    key = gen_publickey_from_rsa(session, rsa, &key_len);
    if(!key) {
        goto __alloc_error;
    }
#ifndef USE_OPENSSL_3
    RSA_free(rsa);
#endif

    memcpy(method_buf, "ssh-rsa", 7);
    *method = method_buf;
    if(method_len) {
        *method_len = 7;
    }
    *pubkeydata = key;
    if(pubkeydata_len) {
        *pubkeydata_len = key_len;
    }
    return 0;

__alloc_error:
#ifndef USE_OPENSSL_3
    if(rsa) {
        RSA_free(rsa);
    }
#endif
    if(method_buf) {
        LIBSSH2_FREE(session, method_buf);
    }

    return _libssh2_error(session,
                          LIBSSH2_ERROR_ALLOC,
                          "Unable to allocate memory for private key data");
}